

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>> *this_00;
  pointer paVar1;
  mapped_type_conflict3 mVar2;
  pointer pBVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  mapped_type pBVar6;
  PolyLine *pPVar7;
  iterator __position;
  _Base_ptr __n;
  pointer ppPVar8;
  pointer puVar9;
  pointer paVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  pointer pvVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  pointer pBVar18;
  Logger *this_01;
  mapped_type *ppBVar19;
  iterator iVar20;
  mapped_type_conflict3 *pmVar21;
  _Rb_tree_node_base *__s;
  aiMesh *paVar22;
  pointer ppPVar23;
  aiVector3D *__s_00;
  aiColor4D *__s_01;
  ulong *puVar24;
  aiFace *paVar25;
  uint *puVar26;
  uint *puVar27;
  long lVar28;
  runtime_error *prVar29;
  uint uVar30;
  FileData *extraout_RDX;
  ulong uVar31;
  FileData *pFVar32;
  FileData *extraout_RDX_00;
  Block *bl;
  mapped_type pBVar33;
  pointer psVar34;
  aiScene *pScene_00;
  pointer puVar35;
  aiFace *paVar36;
  ulong uVar37;
  string *this_02;
  string *__k;
  _Rb_tree_node_base *this_03;
  pointer puVar38;
  ulong uVar39;
  aiVector3D *paVar40;
  Block *bl_00;
  ulong uVar41;
  uint uVar42;
  _Base_ptr p_Var43;
  undefined1 auVar44 [16];
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  LayerMap layers;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  BlockMap blocks_by_name;
  PolyLine *local_258;
  undefined8 uStack_250;
  undefined8 local_248 [3];
  aiScene *local_230;
  aiMesh *local_228;
  _Rb_tree_node_base *local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_218;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  local_1e8;
  pointer local_1c8;
  pointer local_1c0;
  uint *local_1b8;
  PolyLine *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_230 = pScene;
  bVar15 = DefaultLogger::isNullLogger();
  if (!bVar15) {
    pBVar3 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar18 = (output->blocks).
                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar18 != pBVar3;
        pBVar18 = pBVar18 + 1) {
      psVar4 = (pBVar18->lines).
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar34 = (pBVar18->lines).
                     super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar34 != psVar4;
          psVar34 = psVar34 + 1) {
        p_Var5 = (psVar34->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
    }
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [30])"DXF: Unexpanded polycount is ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", vertex count is ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,(char *)local_218._M_impl._0_8_);
    if ((_Base_ptr *)local_218._M_impl._0_8_ !=
        &local_218._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_218._M_impl._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pBVar33 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar6 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar6 == pBVar33) {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DXF: no data blocks loaded","");
    std::runtime_error::runtime_error(prVar29,(string *)local_1a8);
    *(undefined ***)prVar29 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_198._8_8_ = local_1a8 + 8;
  local_1a8._8_4_ = _S_red;
  bl_00 = (Block *)0x0;
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_198._8_8_;
  do {
    __k = &pBVar33->name;
    this_02 = (string *)local_1a8;
    ppBVar19 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)local_1a8,__k);
    *ppBVar19 = pBVar33;
    if (bl_00 == (Block *)0x0) {
      iVar16 = std::__cxx11::string::compare((char *)__k);
      this_02 = __k;
      bl_00 = (Block *)0x0;
      if (iVar16 == 0) {
        bl_00 = pBVar33;
      }
    }
    pBVar33 = pBVar33 + 1;
  } while (pBVar33 != pBVar6);
  if (bl_00 == (Block *)0x0) {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_218._M_impl._0_8_ = &local_218._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"DXF: no ENTITIES data block loaded","");
    std::runtime_error::runtime_error(prVar29,(string *)&local_218);
    *(undefined ***)prVar29 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  ExpandBlockReferences((DXFImporter *)this_02,bl_00,(BlockMap *)local_1a8);
  psVar34 = (bl_00->lines).
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (bl_00->lines).
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar34 != psVar4) {
    mVar2 = 0;
    do {
      pPVar7 = (psVar34->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var5 = (psVar34->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      if ((pPVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&local_218,&pPVar7->layer);
        if ((_Rb_tree_header *)iVar20._M_node == &local_218._M_impl.super__Rb_tree_header) {
          local_230->mNumMeshes = local_230->mNumMeshes + 1;
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&local_218,&pPVar7->layer);
          *pmVar21 = mVar2;
          local_258 = (PolyLine *)0x0;
          uStack_250 = 0;
          local_248[0] = 0;
          local_1b0 = pPVar7;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          _M_realloc_insert<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)&local_258,(iterator)0x0,&local_1b0);
          std::
          vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
          ::push_back(&local_1e8,(value_type *)&local_258);
          if (local_258 != (PolyLine *)0x0) {
            operator_delete(local_258);
          }
          mVar2 = mVar2 + 1;
        }
        else {
          this_00 = (vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                     *)(local_1e8.
                        super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar20._M_node[2]._M_color);
          __position._M_current = *(PolyLine ***)(this_00 + 8);
          local_258 = pPVar7;
          if (__position._M_current == *(PolyLine ***)(this_00 + 0x10)) {
            std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
            _M_realloc_insert<Assimp::DXF::PolyLine_const*>(this_00,__position,&local_258);
          }
          else {
            *__position._M_current = pPVar7;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar34 = psVar34 + 1;
    } while (psVar34 != psVar4);
  }
  pScene_00 = local_230;
  if ((ulong)local_230->mNumMeshes == 0) {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_258 = (PolyLine *)local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"DXF: this file contains no 3d data","");
    std::runtime_error::runtime_error(prVar29,(string *)&local_258);
    *(undefined ***)prVar29 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar41 = (ulong)local_230->mNumMeshes << 3;
  __s = (_Rb_tree_node_base *)operator_new__(uVar41);
  this_03 = __s;
  memset(__s,0,uVar41);
  pScene_00->mMeshes = (aiMesh **)__s;
  pFVar32 = extraout_RDX;
  p_Var43 = local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_218._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_218._M_impl.super__Rb_tree_header) {
    do {
      paVar22 = (aiMesh *)operator_new(0x520);
      paVar22->mPrimitiveTypes = 0;
      paVar22->mNumVertices = 0;
      paVar22->mNumFaces = 0;
      memset(&paVar22->mVertices,0,0xcc);
      paVar22->mBones = (aiBone **)0x0;
      paVar22->mMaterialIndex = 0;
      (paVar22->mName).length = 0;
      (paVar22->mName).data[0] = '\0';
      memset((paVar22->mName).data + 1,0x1b,0x3ff);
      paVar22->mNumAnimMeshes = 0;
      paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar22->mMethod = 0;
      (paVar22->mAABB).mMin.x = 0.0;
      (paVar22->mAABB).mMin.y = 0.0;
      (paVar22->mAABB).mMin.z = 0.0;
      (paVar22->mAABB).mMax.x = 0.0;
      (paVar22->mAABB).mMax.y = 0.0;
      (paVar22->mAABB).mMax.z = 0.0;
      paVar22->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar22->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar22->mNumUVComponents[0] = 0;
      paVar22->mNumUVComponents[1] = 0;
      paVar22->mNumUVComponents[2] = 0;
      paVar22->mNumUVComponents[3] = 0;
      paVar22->mNumUVComponents[4] = 0;
      paVar22->mNumUVComponents[5] = 0;
      paVar22->mNumUVComponents[6] = 0;
      paVar22->mNumUVComponents[7] = 0;
      paVar22->mColors[0] = (aiColor4D *)0x0;
      paVar22->mColors[1] = (aiColor4D *)0x0;
      paVar22->mColors[2] = (aiColor4D *)0x0;
      paVar22->mColors[3] = (aiColor4D *)0x0;
      paVar22->mColors[4] = (aiColor4D *)0x0;
      paVar22->mColors[5] = (aiColor4D *)0x0;
      paVar22->mColors[6] = (aiColor4D *)0x0;
      paVar22->mColors[7] = (aiColor4D *)0x0;
      pScene_00->mMeshes[p_Var43[2]._M_color] = paVar22;
      __n = p_Var43[1]._M_parent;
      if (__n < (_Base_ptr)&DAT_00000400) {
        (paVar22->mName).length = (ai_uint32)__n;
        memcpy((paVar22->mName).data,*(void **)(p_Var43 + 1),(size_t)__n);
        (paVar22->mName).data[(long)__n] = '\0';
      }
      pvVar14 = local_1e8.
                super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppPVar23 = local_1e8.
                 super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[p_Var43[2]._M_color].
                 super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar8 = local_1e8.
                super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[p_Var43[2]._M_color].
                super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppPVar23 == ppPVar8) {
        uVar41 = 0;
        uVar42 = 0;
      }
      else {
        uVar42 = 0;
        uVar41 = 0;
        do {
          puVar35 = ((*ppPVar23)->counts).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar9 = ((*ppPVar23)->counts).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar16 = 0;
          if (puVar35 != puVar9) {
            iVar16 = 0;
            puVar38 = puVar35;
            do {
              iVar16 = iVar16 + *puVar38;
              puVar38 = puVar38 + 1;
            } while (puVar38 != puVar9);
          }
          uVar42 = uVar42 + iVar16;
          uVar41 = (ulong)(uint)((int)uVar41 + (int)((ulong)((long)puVar9 - (long)puVar35) >> 2));
          ppPVar23 = ppPVar23 + 1;
        } while (ppPVar23 != ppPVar8);
      }
      uVar31 = (ulong)uVar42;
      local_228 = paVar22;
      local_220 = p_Var43;
      __s_00 = (aiVector3D *)operator_new__(uVar31 * 0xc);
      if (uVar42 != 0) {
        memset(__s_00,0,((uVar31 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar22->mVertices = __s_00;
      __s_01 = (aiColor4D *)operator_new__(uVar31 << 4);
      if (uVar42 != 0) {
        memset(__s_01,0,uVar31 << 4);
      }
      local_228->mColors[0] = __s_01;
      puVar24 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
      *puVar24 = uVar41;
      paVar36 = (aiFace *)(puVar24 + 1);
      if ((uint)uVar41 != 0) {
        paVar25 = paVar36;
        do {
          paVar25->mNumIndices = 0;
          paVar25->mIndices = (uint *)0x0;
          paVar25 = paVar25 + 1;
        } while (paVar25 != paVar36 + uVar41);
      }
      local_228->mFaces = paVar36;
      local_228->mNumVertices = uVar42;
      local_228->mNumFaces = (uint)uVar41;
      ppPVar23 = pvVar14[local_220[2]._M_color].
                 super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_1c8 = pvVar14[local_220[2]._M_color].
                  super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (ppPVar23 == local_1c8) {
        uVar42 = 0;
      }
      else {
        iVar16 = 0;
        uVar42 = 0;
        do {
          pPVar7 = *ppPVar23;
          puVar26 = (pPVar7->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1b8 = (pPVar7->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_1c0 = ppPVar23;
          if (puVar26 != local_1b8) {
            puVar35 = (pPVar7->indices).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              uVar41 = (ulong)*puVar26;
              paVar36->mNumIndices = *puVar26;
              puVar27 = (uint *)operator_new__(uVar41 * 4);
              paVar36->mIndices = puVar27;
              if (uVar41 != 0) {
                lVar28 = 0;
                uVar31 = 0;
                paVar40 = __s_00;
                do {
                  paVar36->mIndices[uVar31] = iVar16 + (int)uVar31;
                  paVar10 = (pPVar7->positions).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar37 = ((long)(pPVar7->positions).
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 2) *
                           -0x5555555555555555;
                  if (uVar37 - ((long)(pPVar7->colors).
                                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pPVar7->colors).
                                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) != 0) {
                    __assert_fail("pl->positions.size() == pl->colors.size()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/DXF/DXFLoader.cpp"
                                  ,0x14c,
                                  "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)"
                                 );
                  }
                  uVar39 = (ulong)puVar35[uVar31];
                  if (uVar37 < uVar39 || uVar37 - uVar39 == 0) {
                    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_258 = (PolyLine *)local_248;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_258,"DXF: vertex index out of bounds","");
                    std::runtime_error::runtime_error(prVar29,(string *)&local_258);
                    *(undefined ***)prVar29 = &PTR__runtime_error_00900168;
                    __cxa_throw(prVar29,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  __s_00 = paVar40 + 1;
                  paVar40->z = paVar10[uVar39].z;
                  fVar11 = paVar10[uVar39].y;
                  paVar40->x = paVar10[uVar39].x;
                  paVar40->y = fVar11;
                  paVar1 = (pPVar7->colors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start + puVar35[uVar31];
                  fVar11 = paVar1->g;
                  fVar12 = paVar1->b;
                  fVar13 = paVar1->a;
                  __s_01->r = paVar1->r;
                  __s_01->g = fVar11;
                  __s_01->b = fVar12;
                  __s_01->a = fVar13;
                  __s_01 = __s_01 + 1;
                  uVar31 = uVar31 + 1;
                  lVar28 = lVar28 + -4;
                  paVar40 = __s_00;
                } while (uVar41 != uVar31);
                iVar16 = iVar16 + (int)uVar31;
                puVar35 = (pointer)((long)puVar35 - lVar28);
              }
              uVar30 = paVar36->mNumIndices - 1;
              uVar17 = 8;
              if (uVar30 < 3) {
                uVar17 = *(uint *)(&DAT_0077e354 + (ulong)uVar30 * 4);
              }
              uVar42 = uVar42 | uVar17;
              paVar36 = paVar36 + 1;
              puVar26 = puVar26 + 1;
            } while (puVar26 != local_1b8);
          }
          ppPVar23 = local_1c0 + 1;
        } while (ppPVar23 != local_1c8);
      }
      local_228->mPrimitiveTypes = uVar42;
      local_228->mMaterialIndex = 0;
      this_03 = local_220;
      auVar44 = std::_Rb_tree_increment(local_220);
      pFVar32 = auVar44._8_8_;
      p_Var43 = auVar44._0_8_;
      pScene_00 = local_230;
    } while ((_Rb_tree_header *)p_Var43 != &local_218._M_impl.super__Rb_tree_header);
  }
  GenerateHierarchy((DXFImporter *)this_03,pScene_00,pFVar32);
  GenerateMaterials((DXFImporter *)this_03,pScene_00,extraout_RDX_00);
  std::
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ::~vector(&local_1e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_218);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               *)local_1a8);
  return;
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}